

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeDrawCmdShowMeshAndBoundingBox
               (ImGuiWindow *window,ImDrawList *draw_list,ImDrawCmd *draw_cmd,int elem_offset,
               bool show_mesh,bool show_aabb)

{
  ImDrawList *this;
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  ImVec2 IVar4;
  undefined1 auVar5 [16];
  long lVar6;
  int iVar7;
  ulong uVar8;
  ImGuiContext *pIVar9;
  ImVec2 IVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  float fVar17;
  float fVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ImVec2 triangle [3];
  ImVec2 local_a8;
  ImVec2 local_98;
  ImVec2 local_88 [4];
  ImGuiContext *local_68;
  ImVec2 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar9 = GImGui;
  if ((char)elem_offset == '\0' && !show_mesh) {
    __assert_fail("show_mesh || show_aabb",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x27df,
                  "static void ImGui::ShowMetricsWindow(bool *)::Funcs::NodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow *, const ImDrawList *, const ImDrawCmd *, int, bool, bool)"
                 );
  }
  if ((int)(window->Pos).x < 1) {
    IVar10.x = 0.0;
    IVar10.y = 0.0;
  }
  else {
    IVar10 = window->Size;
  }
  this = &GImGui->ForegroundDrawList;
  uVar1 = *(undefined8 *)&(draw_list->CmdBuffer).Capacity;
  uVar2 = *(undefined8 *)((long)&(draw_list->CmdBuffer).Data + 4);
  uVar3 = (GImGui->ForegroundDrawList).Flags;
  (GImGui->ForegroundDrawList).Flags = uVar3 & 0xfffffffe;
  uVar11 = (uint)draw_cmd;
  fVar13 = (float)uVar1;
  fVar12 = (float)((ulong)uVar1 >> 0x20);
  fVar14 = (float)uVar2;
  fVar17 = (float)((ulong)uVar2 >> 0x20);
  if (uVar11 < (draw_list->CmdBuffer).Size + uVar11) {
    uStack_50 = 0;
    uStack_40 = 0;
    local_68 = pIVar9;
    uVar8 = (ulong)draw_cmd & 0xffffffff;
    auVar22 = _DAT_001a14d0;
    auVar23 = _DAT_001a13b0;
    local_58 = uVar1;
    local_48 = uVar2;
    do {
      local_88[0].x = 0.0;
      local_88[0].y = 0.0;
      local_88[1].x = 0.0;
      local_88[1].y = 0.0;
      local_88[2].x = 0.0;
      local_88[2].y = 0.0;
      fVar13 = (window->SizeFull).x;
      lVar6 = 0;
      fVar12 = auVar23._0_4_;
      fVar14 = auVar23._4_4_;
      uVar15 = auVar23._8_4_;
      uVar16 = auVar23._12_4_;
      fVar17 = auVar22._0_4_;
      fVar18 = auVar22._4_4_;
      uVar19 = auVar22._8_4_;
      uVar20 = auVar22._12_4_;
      do {
        iVar7 = (int)(uVar8 + lVar6);
        if (IVar10 != (ImVec2)0x0) {
          iVar7 = *(int *)((long)IVar10 + (uVar8 + lVar6 & 0xffffffff) * 4);
        }
        if ((int)fVar13 <= iVar7) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                        ,0x52f,
                        "const T &ImVector<ImDrawVert>::operator[](int) const [T = ImDrawVert]");
        }
        IVar4 = *(ImVec2 *)((long)window->ContentSize + (long)iVar7 * 0x14);
        auVar21._8_8_ = 0;
        auVar21._0_4_ = IVar4.x;
        auVar21._4_4_ = IVar4.y;
        local_88[lVar6] = IVar4;
        auVar22._4_4_ = fVar14;
        auVar22._0_4_ = fVar12;
        auVar22._8_4_ = uVar15;
        auVar22._12_4_ = uVar16;
        auVar23 = minps(auVar21,auVar22);
        auVar5._4_4_ = fVar18;
        auVar5._0_4_ = fVar17;
        auVar5._8_4_ = uVar19;
        auVar5._12_4_ = uVar20;
        auVar22 = maxps(auVar21,auVar5);
        lVar6 = lVar6 + 1;
        fVar12 = auVar23._0_4_;
        fVar14 = auVar23._4_4_;
        uVar15 = auVar23._8_4_;
        uVar16 = auVar23._12_4_;
        fVar17 = auVar22._0_4_;
        fVar18 = auVar22._4_4_;
        uVar19 = auVar22._8_4_;
        uVar20 = auVar22._12_4_;
      } while (lVar6 != 3);
      if ((char)elem_offset != '\0') {
        ImDrawList::AddPolyline(this,local_88,3,0xff00ffff,true,1.0);
      }
      uVar8 = uVar8 + 3;
    } while ((uint)uVar8 < (draw_list->CmdBuffer).Size + uVar11);
    local_98.y = (float)(int)fVar14;
    local_98.x = (float)(int)fVar12;
    local_a8.y = (float)(int)fVar18;
    local_a8.x = (float)(int)fVar17;
    pIVar9 = local_68;
    fVar13 = (float)local_58;
    fVar12 = local_58._4_4_;
    fVar14 = (float)local_48;
    fVar17 = local_48._4_4_;
  }
  if (show_mesh) {
    local_88[0].y = (float)(int)fVar12;
    local_88[0].x = (float)(int)fVar13;
    local_60.y = (float)(int)fVar17;
    local_60.x = (float)(int)fVar14;
    ImDrawList::AddRect(this,local_88,&local_60,0xffff00ff,0.0,0xf,1.0);
    local_88[0] = local_98;
    local_60 = local_a8;
    ImDrawList::AddRect(this,local_88,&local_60,0xffffff00,0.0,0xf,1.0);
  }
  (pIVar9->ForegroundDrawList).Flags = uVar3;
  return;
}

Assistant:

static void NodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow* window, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }